

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3CursorSeekStmt(Fts3Cursor *pCsr,sqlite3_stmt **ppStmt)

{
  sqlite3_vtab *psVar1;
  int iVar2;
  char *zSql;
  sqlite3_stmt *psVar3;
  
  psVar3 = pCsr->pStmt;
  iVar2 = 0;
  if (psVar3 == (sqlite3_stmt *)0x0) {
    psVar1 = (pCsr->base).pVtab;
    zSql = sqlite3_mprintf("SELECT %s WHERE rowid = ?",psVar1[0x11].zErrMsg);
    if (zSql == (char *)0x0) {
      return 7;
    }
    iVar2 = sqlite3LockAndPrepare
                      ((sqlite3 *)psVar1[1].pModule,zSql,-1,1,(Vdbe *)0x0,&pCsr->pStmt,(char **)0x0)
    ;
    sqlite3_free(zSql);
    psVar3 = pCsr->pStmt;
  }
  *ppStmt = psVar3;
  return iVar2;
}

Assistant:

static int fts3CursorSeekStmt(Fts3Cursor *pCsr, sqlite3_stmt **ppStmt){
  int rc = SQLITE_OK;
  if( pCsr->pStmt==0 ){
    Fts3Table *p = (Fts3Table *)pCsr->base.pVtab;
    char *zSql;
    zSql = sqlite3_mprintf("SELECT %s WHERE rowid = ?", p->zReadExprlist);
    if( !zSql ) return SQLITE_NOMEM;
    rc = sqlite3_prepare_v2(p->db, zSql, -1, &pCsr->pStmt, 0);
    sqlite3_free(zSql);
  }
  *ppStmt = pCsr->pStmt;
  return rc;
}